

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void set_snode_merge(lyxp_set *set1,lyxp_set *set2)

{
  uint uVar1;
  uint32_t uVar2;
  lyxp_set_nodes *plVar3;
  LY_ERR *pLVar4;
  lyxp_set_nodes *plVar5;
  uint local_24;
  uint local_20;
  uint32_t j;
  uint32_t i;
  uint32_t orig_used;
  lyxp_set *set2_local;
  lyxp_set *set1_local;
  
  if (((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY)) &&
     ((set2->type == LYXP_SET_SNODE_SET || (set2->type == LYXP_SET_EMPTY)))) {
    if (set2->type != LYXP_SET_EMPTY) {
      if (set1->type == LYXP_SET_EMPTY) {
        memcpy(set1,set2,0x30);
      }
      else {
        if (set1->size < set1->used + set2->used) {
          set1->size = set1->used + set2->used;
          plVar3 = (lyxp_set_nodes *)ly_realloc((set1->val).nodes,(ulong)set1->size << 4);
          (set1->val).nodes = plVar3;
          if ((set1->val).nodes == (lyxp_set_nodes *)0x0) {
            pLVar4 = ly_errno_location();
            *pLVar4 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_snode_merge");
            return;
          }
        }
        uVar1 = set1->used;
        for (local_20 = 0; local_20 < set2->used; local_20 = local_20 + 1) {
          local_24 = 0;
          while ((local_24 < uVar1 &&
                 ((set1->val).nodes[local_24].node != (set2->val).nodes[local_20].node))) {
            local_24 = local_24 + 1;
          }
          if (local_24 == uVar1) {
            plVar3 = (set1->val).nodes + set1->used;
            plVar5 = (set2->val).nodes + local_20;
            plVar3->node = plVar5->node;
            uVar2 = plVar5->pos;
            plVar3->type = plVar5->type;
            plVar3->pos = uVar2;
            set1->used = set1->used + 1;
          }
        }
        free((set2->val).nodes);
        memset(set2,0,0x30);
      }
    }
    return;
  }
  __assert_fail("((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY)) && ((set2->type == LYXP_SET_SNODE_SET) || (set2->type == LYXP_SET_EMPTY))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                ,0x341,"void set_snode_merge(struct lyxp_set *, struct lyxp_set *)");
}

Assistant:

static void
set_snode_merge(struct lyxp_set *set1, struct lyxp_set *set2)
{
    uint32_t orig_used, i, j;

    assert(((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY))
        && ((set2->type == LYXP_SET_SNODE_SET) || (set2->type == LYXP_SET_EMPTY)));

    if (set2->type == LYXP_SET_EMPTY) {
        return;
    }

    if (set1->type == LYXP_SET_EMPTY) {
        memcpy(set1, set2, sizeof *set1);
        return;
    }

    if (set1->used + set2->used > set1->size) {
        set1->size = set1->used + set2->used;
        set1->val.snodes = ly_realloc(set1->val.snodes, set1->size * sizeof *set1->val.snodes);
        if (!set1->val.snodes) {
            LOGMEM;
            return;
        }
    }

    orig_used = set1->used;

    for (i = 0; i < set2->used; ++i) {
        for (j = 0; j < orig_used; ++j) {
            /* detect duplicities */
            if (set1->val.snodes[j].snode == set2->val.snodes[i].snode) {
                break;
            }
        }

        if (j == orig_used) {
            memcpy(&set1->val.snodes[set1->used], &set2->val.snodes[i], sizeof *set2->val.snodes);
            ++set1->used;
        }
    }

    free(set2->val.snodes);
    memset(set2, 0, sizeof *set2);
}